

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_descriptor_multi(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  uint uVar2;
  miniscript_node_t *pmVar3;
  
  uVar2 = 0;
  pmVar1 = node->child;
  for (pmVar3 = pmVar1; pmVar3 != (miniscript_node_t *)0x0; pmVar3 = pmVar3->next) {
    uVar2 = uVar2 + 1;
  }
  if (((((0xffffffeb < uVar2 - 0x16) && (pmVar3 = pmVar1->next, pmVar3 != (miniscript_node_t *)0x0))
       && (pmVar1->info == (miniscript_item_t *)0x0)) &&
      ((pmVar1->kind == 8 && (0 < pmVar1->number)))) && ((uint)pmVar1->number <= uVar2)) {
    while ((pmVar3->info == (miniscript_item_t *)0x0 && ((pmVar3->kind & 0x20) != 0))) {
      pmVar3 = pmVar3->next;
      if (pmVar3 == (miniscript_node_t *)0x0) {
        node->type_properties = node->info->type_properties;
        return 0;
      }
    }
  }
  return -2;
}

Assistant:

static int verify_descriptor_multi(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *top = NULL;
    struct miniscript_node_t *key = NULL;
    uint32_t require_num = 0;
    uint32_t count = (uint32_t) get_child_list_count(node);
    (void)parent;

    if ((count < 2) || (count - 1 > DESCRIPTOR_MINISCRIPT_MUILTI_MAX))
        return WALLY_EINVAL;

    top = node->child;
    require_num = (uint32_t) top->number;
    if (!top->next || top->info || (top->kind != DESCRIPTOR_KIND_NUMBER) ||
        (top->number <= 0) || (count < require_num))
        return WALLY_EINVAL;

    key = top->next;
    while (key) {
        if (key->info || !(key->kind & DESCRIPTOR_KIND_KEY))
            return WALLY_EINVAL;

        key = key->next;
    }

    node->type_properties = node->info->type_properties;
    return WALLY_OK;
}